

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netaddress.cpp
# Opt level: O2

bool __thiscall CNetAddr::IsRFC5737(CNetAddr *this)

{
  bool bVar1;
  bool bVar2;
  long in_FS_OFFSET;
  array<unsigned_char,_3UL> local_21;
  array<unsigned_char,_3UL> local_1e;
  array<unsigned_char,_3UL> local_1b;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->m_net == NET_IPV4) {
    local_1b._M_elems[0] = 0xc0;
    local_1b._M_elems[1] = '\0';
    local_1b._M_elems[2] = '\x02';
    bVar1 = util::HasPrefix<prevector<16u,unsigned_char,unsigned_int,int>,3ul>
                      (&this->m_addr,&local_1b);
    bVar2 = true;
    if (!bVar1) {
      local_1e._M_elems[0] = 0xc6;
      local_1e._M_elems[1] = '3';
      local_1e._M_elems[2] = 'd';
      bVar1 = util::HasPrefix<prevector<16u,unsigned_char,unsigned_int,int>,3ul>
                        (&this->m_addr,&local_1e);
      if (!bVar1) {
        local_21._M_elems[0] = 0xcb;
        local_21._M_elems[1] = '\0';
        local_21._M_elems[2] = 'q';
        bVar2 = util::HasPrefix<prevector<16u,unsigned_char,unsigned_int,int>,3ul>
                          (&this->m_addr,&local_21);
      }
    }
  }
  else {
    bVar2 = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool CNetAddr::IsRFC5737() const
{
    return IsIPv4() && (HasPrefix(m_addr, std::array<uint8_t, 3>{192, 0, 2}) ||
                        HasPrefix(m_addr, std::array<uint8_t, 3>{198, 51, 100}) ||
                        HasPrefix(m_addr, std::array<uint8_t, 3>{203, 0, 113}));
}